

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_hkdf_input(psa_hkdf_key_derivation_t *hkdf,psa_algorithm_t hash_alg,
              psa_key_derivation_step_t step,uint8_t *data,size_t data_length)

{
  uint8_t uVar1;
  psa_status_t pVar2;
  uint8_t *puVar3;
  psa_status_t status;
  size_t data_length_local;
  uint8_t *data_local;
  psa_key_derivation_step_t step_local;
  psa_algorithm_t hash_alg_local;
  psa_hkdf_key_derivation_t *hkdf_local;
  
  if (step == 0x101) {
    if ((hkdf->field_0x1f2 & 3) == 0) {
      pVar2 = psa_hmac_setup_internal(&hkdf->hmac,(uint8_t *)0x0,0,hash_alg);
      if (pVar2 != 0) {
        return pVar2;
      }
      hkdf->field_0x1f2 = hkdf->field_0x1f2 & 0xfc | 1;
    }
    if ((hkdf->field_0x1f2 & 3) == 1) {
      hkdf_local._4_4_ = psa_hash_update(&(hkdf->hmac).hash_ctx,data,data_length);
      if ((hkdf_local._4_4_ == 0) &&
         (hkdf_local._4_4_ = psa_hmac_finish_internal(&hkdf->hmac,hkdf->prk,0x40),
         hkdf_local._4_4_ == 0)) {
        if ((hash_alg & 0xff | 0x1000000) == 0x1000001) {
          uVar1 = '\x10';
        }
        else if ((hash_alg & 0xff | 0x1000000) == 0x1000002) {
          uVar1 = '\x10';
        }
        else if ((hash_alg & 0xff | 0x1000000) == 0x1000003) {
          uVar1 = '\x10';
        }
        else if ((hash_alg & 0xff | 0x1000000) == 0x1000004) {
          uVar1 = '\x14';
        }
        else if ((hash_alg & 0xff | 0x1000000) == 0x1000005) {
          uVar1 = '\x14';
        }
        else if ((hash_alg & 0xff | 0x1000000) == 0x1000008) {
          uVar1 = '\x1c';
        }
        else if ((hash_alg & 0xff | 0x1000000) == 0x1000009) {
          uVar1 = ' ';
        }
        else if ((hash_alg & 0xff | 0x1000000) == 0x100000a) {
          uVar1 = '0';
        }
        else if ((hash_alg & 0xff | 0x1000000) == 0x100000b) {
          uVar1 = '@';
        }
        else if ((hash_alg & 0xff | 0x1000000) == 0x100000c) {
          uVar1 = '\x1c';
        }
        else if ((hash_alg & 0xff | 0x1000000) == 0x100000d) {
          uVar1 = ' ';
        }
        else if ((hash_alg & 0xff | 0x1000000) == 0x1000010) {
          uVar1 = '\x1c';
        }
        else if ((hash_alg & 0xff | 0x1000000) == 0x1000011) {
          uVar1 = ' ';
        }
        else if ((hash_alg & 0xff | 0x1000000) == 0x1000012) {
          uVar1 = '0';
        }
        else {
          uVar1 = '\0';
          if ((hash_alg & 0xff | 0x1000000) == 0x1000013) {
            uVar1 = '@';
          }
        }
        hkdf->offset_in_block = uVar1;
        hkdf->block_number = '\0';
        hkdf->field_0x1f2 = hkdf->field_0x1f2 & 0xfc | 2;
        hkdf_local._4_4_ = 0;
      }
    }
    else {
      hkdf_local._4_4_ = -0x89;
    }
  }
  else if (step == 0x202) {
    if ((hkdf->field_0x1f2 & 3) == 0) {
      hkdf_local._4_4_ = psa_hmac_setup_internal(&hkdf->hmac,data,data_length,hash_alg);
      if (hkdf_local._4_4_ == 0) {
        hkdf->field_0x1f2 = hkdf->field_0x1f2 & 0xfc | 1;
        hkdf_local._4_4_ = 0;
      }
    }
    else {
      hkdf_local._4_4_ = -0x89;
    }
  }
  else if (step == 0x203) {
    if ((hkdf->field_0x1f2 & 3) == 3) {
      hkdf_local._4_4_ = -0x89;
    }
    else if (((byte)hkdf->field_0x1f2 >> 2 & 1) == 0) {
      hkdf->info_length = data_length;
      if (data_length != 0) {
        puVar3 = (uint8_t *)calloc(1,data_length);
        hkdf->info = puVar3;
        if (hkdf->info == (uint8_t *)0x0) {
          return -0x8d;
        }
        memcpy(hkdf->info,data,data_length);
      }
      hkdf->field_0x1f2 = hkdf->field_0x1f2 & 0xfb | 4;
      hkdf_local._4_4_ = 0;
    }
    else {
      hkdf_local._4_4_ = -0x89;
    }
  }
  else {
    hkdf_local._4_4_ = -0x87;
  }
  return hkdf_local._4_4_;
}

Assistant:

static psa_status_t psa_hkdf_input( psa_hkdf_key_derivation_t *hkdf,
                                    psa_algorithm_t hash_alg,
                                    psa_key_derivation_step_t step,
                                    const uint8_t *data,
                                    size_t data_length )
{
    psa_status_t status;
    switch( step )
    {
        case PSA_KEY_DERIVATION_INPUT_SALT:
            if( hkdf->state != HKDF_STATE_INIT )
                return( PSA_ERROR_BAD_STATE );
            status = psa_hmac_setup_internal( &hkdf->hmac,
                                              data, data_length,
                                              hash_alg );
            if( status != PSA_SUCCESS )
                return( status );
            hkdf->state = HKDF_STATE_STARTED;
            return( PSA_SUCCESS );
        case PSA_KEY_DERIVATION_INPUT_SECRET:
            /* If no salt was provided, use an empty salt. */
            if( hkdf->state == HKDF_STATE_INIT )
            {
                status = psa_hmac_setup_internal( &hkdf->hmac,
                                                  NULL, 0,
                                                  hash_alg );
                if( status != PSA_SUCCESS )
                    return( status );
                hkdf->state = HKDF_STATE_STARTED;
            }
            if( hkdf->state != HKDF_STATE_STARTED )
                return( PSA_ERROR_BAD_STATE );
            status = psa_hash_update( &hkdf->hmac.hash_ctx,
                                      data, data_length );
            if( status != PSA_SUCCESS )
                return( status );
            status = psa_hmac_finish_internal( &hkdf->hmac,
                                               hkdf->prk,
                                               sizeof( hkdf->prk ) );
            if( status != PSA_SUCCESS )
                return( status );
            hkdf->offset_in_block = PSA_HASH_SIZE( hash_alg );
            hkdf->block_number = 0;
            hkdf->state = HKDF_STATE_KEYED;
            return( PSA_SUCCESS );
        case PSA_KEY_DERIVATION_INPUT_INFO:
            if( hkdf->state == HKDF_STATE_OUTPUT )
                return( PSA_ERROR_BAD_STATE );
            if( hkdf->info_set )
                return( PSA_ERROR_BAD_STATE );
            hkdf->info_length = data_length;
            if( data_length != 0 )
            {
                hkdf->info = mbedtls_calloc( 1, data_length );
                if( hkdf->info == NULL )
                    return( PSA_ERROR_INSUFFICIENT_MEMORY );
                memcpy( hkdf->info, data, data_length );
            }
            hkdf->info_set = 1;
            return( PSA_SUCCESS );
        default:
            return( PSA_ERROR_INVALID_ARGUMENT );
    }
}